

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer_holder.hpp
# Opt level: O0

void * __thiscall
boost::python::objects::
pointer_holder<std::unique_ptr<LFPConsumer_python,_std::default_delete<LFPConsumer_python>_>,_LFPConsumer_python>
::holds(pointer_holder<std::unique_ptr<LFPConsumer_python,_std::default_delete<LFPConsumer_python>_>,_LFPConsumer_python>
        *this,type_info dst_t,bool null_ptr_only)

{
  bool bVar1;
  bool bVar2;
  LFPConsumer_python *pLVar3;
  type_info tVar4;
  byte in_DL;
  type_info in_RSI;
  pointer_holder<std::unique_ptr<LFPConsumer_python,_std::default_delete<LFPConsumer_python>_>,_LFPConsumer_python>
  *in_RDI;
  type_info src_t;
  void *wrapped;
  non_const_value *p;
  LFPConsumer_python *p0;
  type_info *in_stack_ffffffffffffff78;
  type_info *in_stack_ffffffffffffff80;
  LFPConsumer_python *local_8;
  
  type_id<std::unique_ptr<LFPConsumer_python,std::default_delete<LFPConsumer_python>>>();
  bVar1 = type_info::operator==(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  bVar2 = false;
  if (bVar1) {
    bVar2 = false;
    if ((in_DL & 1) != 0) {
      pLVar3 = get_pointer<LFPConsumer_python>
                         ((unique_ptr<LFPConsumer_python,_std::default_delete<LFPConsumer_python>_>
                           *)0x3fefb6);
      bVar2 = pLVar3 != (LFPConsumer_python *)0x0;
    }
    bVar2 = (bool)(bVar2 ^ 1);
  }
  if (bVar2) {
    local_8 = (LFPConsumer_python *)&in_RDI->m_p;
  }
  else {
    pLVar3 = get_pointer<LFPConsumer_python>
                       ((unique_ptr<LFPConsumer_python,_std::default_delete<LFPConsumer_python>_> *)
                        0x3feff9);
    if (pLVar3 == (LFPConsumer_python *)0x0) {
      local_8 = (LFPConsumer_python *)0x0;
    }
    else {
      local_8 = (LFPConsumer_python *)holds_wrapped(in_RDI,in_RSI,pLVar3,pLVar3);
      if (local_8 == (LFPConsumer_python *)0x0) {
        tVar4 = type_id<LFPConsumer_python>();
        bVar2 = type_info::operator==(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
        local_8 = pLVar3;
        if (!bVar2) {
          local_8 = (LFPConsumer_python *)find_dynamic_type(pLVar3,tVar4,in_RSI);
        }
      }
    }
  }
  return local_8;
}

Assistant:

void* pointer_holder<Pointer, Value>::holds(type_info dst_t, bool null_ptr_only)
{
    typedef typename boost::python::detail::remove_const< Value >::type non_const_value;

    if (dst_t == python::type_id<Pointer>()
        && !(null_ptr_only && get_pointer(this->m_p))
    )
        return &this->m_p;

    Value* p0
#  if BOOST_WORKAROUND(__SUNPRO_CC, BOOST_TESTED_AT(0x590))
        = static_cast<Value*>( get_pointer(this->m_p) )
#  else 
        = get_pointer(this->m_p)
#  endif
        ;
    non_const_value* p = const_cast<non_const_value*>( p0 );

    if (p == 0)
        return 0;
    
    if (void* wrapped = holds_wrapped(dst_t, p, p))
        return wrapped;
    
    type_info src_t = python::type_id<non_const_value>();
    return src_t == dst_t ? p : find_dynamic_type(p, src_t, dst_t);
}